

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_copyCCtx(ZSTD_CCtx *dstCCtx,ZSTD_CCtx *srcCCtx,unsigned_long_long pledgedSrcSize)

{
  ZSTD_freeFunction p_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  U32 UVar7;
  U32 UVar8;
  size_t sVar9;
  ulong pledgedSrcSize_00;
  long lVar10;
  ZSTD_CCtx_params *pZVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  long lVar14;
  ZSTD_CCtx_params in_stack_fffffffffffffee8;
  undefined1 local_98 [12];
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  ulong local_78;
  undefined4 local_70;
  
  sVar9 = 0xffffffffffffffc4;
  if (srcCCtx->stage == ZSTDcs_init) {
    lVar14 = 0;
    pledgedSrcSize_00 = -(ulong)(pledgedSrcSize == 0) | pledgedSrcSize;
    sVar9 = srcCCtx->inBuffSize;
    (dstCCtx->customMem).opaque = (srcCCtx->customMem).opaque;
    p_Var1 = (srcCCtx->customMem).customFree;
    (dstCCtx->customMem).customAlloc = (srcCCtx->customMem).customAlloc;
    (dstCCtx->customMem).customFree = p_Var1;
    pZVar11 = &dstCCtx->requestedParams;
    puVar12 = (undefined8 *)local_98;
    for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar12 = *(undefined8 *)pZVar11;
      pZVar11 = (ZSTD_CCtx_params *)&(pZVar11->cParams).chainLog;
      puVar12 = puVar12 + 1;
    }
    uVar2 = (srcCCtx->appliedParams).cParams.hashLog;
    uVar3 = (srcCCtx->appliedParams).cParams.searchLog;
    uVar4 = (srcCCtx->appliedParams).cParams.minMatch;
    uStack_84 = uVar4;
    uStack_80._0_4_ = (srcCCtx->appliedParams).cParams.targetLength;
    uStack_80._4_4_ = (srcCCtx->appliedParams).cParams.strategy;
    local_98._4_4_ = (srcCCtx->appliedParams).cParams.windowLog;
    local_98._8_4_ = (srcCCtx->appliedParams).cParams.chainLog;
    uStack_8c = uVar2;
    local_88 = uVar3;
    local_78 = (ulong)(pledgedSrcSize_00 != 0xffffffffffffffff);
    local_70 = 0;
    puVar12 = (undefined8 *)local_98;
    puVar13 = (undefined8 *)&stack0xfffffffffffffee8;
    for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar13 = *puVar12;
      puVar12 = puVar12 + 1;
      puVar13 = puVar13 + 1;
    }
    ZSTD_resetCCtx_internal
              (dstCCtx,in_stack_fffffffffffffee8,pledgedSrcSize_00,ZSTDcrp_noMemset,
               (uint)(sVar9 != 0));
    if ((srcCCtx->appliedParams).cParams.strategy != ZSTD_fast) {
      lVar14 = 1L << ((byte)(srcCCtx->appliedParams).cParams.chainLog & 0x3f);
    }
    memcpy((dstCCtx->blockState).matchState.hashTable,(srcCCtx->blockState).matchState.hashTable,
           ((1L << ((byte)(srcCCtx->blockState).matchState.hashLog3 & 0x3f)) +
           (1L << ((byte)(srcCCtx->appliedParams).cParams.hashLog & 0x3f)) + lVar14) * 4);
    pBVar5 = (srcCCtx->blockState).matchState.window.base;
    pBVar6 = (srcCCtx->blockState).matchState.window.dictBase;
    UVar7 = (srcCCtx->blockState).matchState.window.dictLimit;
    UVar8 = (srcCCtx->blockState).matchState.window.lowLimit;
    (dstCCtx->blockState).matchState.window.nextSrc =
         (srcCCtx->blockState).matchState.window.nextSrc;
    (dstCCtx->blockState).matchState.window.base = pBVar5;
    (dstCCtx->blockState).matchState.window.dictBase = pBVar6;
    (dstCCtx->blockState).matchState.window.dictLimit = UVar7;
    (dstCCtx->blockState).matchState.window.lowLimit = UVar8;
    (dstCCtx->blockState).matchState.nextToUpdate = (srcCCtx->blockState).matchState.nextToUpdate;
    (dstCCtx->blockState).matchState.nextToUpdate3 = (srcCCtx->blockState).matchState.nextToUpdate3;
    (dstCCtx->blockState).matchState.loadedDictEnd = (srcCCtx->blockState).matchState.loadedDictEnd;
    dstCCtx->dictID = srcCCtx->dictID;
    memcpy((dstCCtx->blockState).prevCBlock,(srcCCtx->blockState).prevCBlock,0x11f0);
    sVar9 = 0;
  }
  return sVar9;
}

Assistant:

size_t ZSTD_copyCCtx(ZSTD_CCtx* dstCCtx, const ZSTD_CCtx* srcCCtx, unsigned long long pledgedSrcSize)
{
    ZSTD_frameParameters fParams = { 1 /*content*/, 0 /*checksum*/, 0 /*noDictID*/ };
    ZSTD_buffered_policy_e const zbuff = (ZSTD_buffered_policy_e)(srcCCtx->inBuffSize>0);
    ZSTD_STATIC_ASSERT((U32)ZSTDb_buffered==1);
    if (pledgedSrcSize==0) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;
    fParams.contentSizeFlag = (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN);

    return ZSTD_copyCCtx_internal(dstCCtx, srcCCtx,
                                fParams, pledgedSrcSize,
                                zbuff);
}